

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::VerifyCacheIdToPropertyIdMap(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int **ppiVar4;
  undefined4 *puVar5;
  uint local_18;
  uint i;
  uint count;
  FunctionBody *this_local;
  
  uVar3 = GetInlineCacheCount(this);
  local_18 = 0;
  do {
    if (uVar3 <= local_18) {
      return;
    }
    ppiVar4 = Memory::WriteBarrierPtr::operator_cast_to_int__
                        ((WriteBarrierPtr *)&this->cacheIdToPropertyIdMap);
    if ((*ppiVar4)[local_18] == -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x10a7,
                                  "(this->cacheIdToPropertyIdMap[i] != Js::Constants::NoProperty)",
                                  "this->cacheIdToPropertyIdMap[i] != Js::Constants::NoProperty");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void FunctionBody::VerifyCacheIdToPropertyIdMap()
    {
        uint count = this->GetInlineCacheCount();
        for (uint i = 0; i < count; i++)
        {
            Assert(this->cacheIdToPropertyIdMap[i] != Js::Constants::NoProperty);
        }
    }